

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall
QTreeModel::emitDataChanged(QTreeModel *this,QTreeWidgetItem *item,int column,QList<int> *roles)

{
  bool bVar1;
  QTreeWidgetItem *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  QTreeWidgetItem *local_60;
  QTreeWidgetItem *pQStack_58;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_50;
  QTreeWidgetItem *local_48;
  QTreeWidgetItem *pQStack_40;
  QTreeWidgetItem *pQStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)&this->field_0x8 + 0x30) & 2) == 0) {
    if ((this->headerItem == item) && (column < (int)(item->values).d.size)) {
      if (column != -1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QAbstractItemModel::headerDataChanged((Orientation)this,1,column);
          return;
        }
        goto LAB_0054e88a;
      }
      local_48 = (QTreeWidgetItem *)0xffffffffffffffff;
      pQStack_40 = (QTreeWidgetItem *)0x0;
      pQStack_38 = (QTreeWidgetItem *)0x0;
      (**(code **)(*(long *)this + 0x80))(this);
      QAbstractItemModel::headerDataChanged((Orientation)this,1,0);
    }
    else {
      bVar1 = this->skipPendingSort;
      this->skipPendingSort = true;
      local_60 = (QTreeWidgetItem *)0xffffffffffffffff;
      pQStack_58 = (QTreeWidgetItem *)0x0;
      tStack_50.ptr = (QAbstractItemModel *)0x0;
      if (column == -1) {
        index((QTreeModel *)&local_60,(char *)this,(int)item);
        pQVar2 = local_60;
        iVar3 = (**(code **)(*(long *)this + 0x80))(this);
        local_48 = (QTreeWidgetItem *)CONCAT44(iVar3 + -1,(int)pQVar2);
        pQStack_40 = item;
        pQStack_38 = (QTreeWidgetItem *)this;
      }
      else {
        index((QTreeModel *)&local_60,(char *)this,(int)item);
        pQStack_38 = (QTreeWidgetItem *)tStack_50.ptr;
        local_48 = local_60;
        pQStack_40 = pQStack_58;
      }
      QAbstractItemModel::dataChanged
                ((QModelIndex *)this,(QModelIndex *)&local_60,(QList_conflict *)&local_48);
      this->skipPendingSort = bVar1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0054e88a:
  __stack_chk_fail();
}

Assistant:

void QTreeModel::emitDataChanged(QTreeWidgetItem *item, int column, const QList<int> &roles)
{
    if (signalsBlocked())
        return;

    if (headerItem == item && column < item->columnCount()) {
        if (column == -1)
            emit headerDataChanged(Qt::Horizontal, 0, columnCount() - 1);
        else
            emit headerDataChanged(Qt::Horizontal, column, column);
        return;
    }

    SkipSorting skipSorting(this); //This is a little bit wrong, but not doing it would kill performance

    QModelIndex bottomRight, topLeft;
    if (column == -1) {
        topLeft = index(item, 0);
        bottomRight = createIndex(topLeft.row(), columnCount() - 1, item);
    } else {
        topLeft = index(item, column);
        bottomRight = topLeft;
    }
    emit dataChanged(topLeft, bottomRight, roles);
}